

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * build_ustar_entry_name(char *dest,char *src,size_t src_length,char *insert)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar5;
  size_t insert_length;
  size_t suffix_length;
  int need_slash;
  char *p;
  char *filename_end;
  char *filename;
  char *suffix_end;
  char *suffix;
  char *prefix_end;
  char *prefix;
  long local_78;
  long local_70;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_38;
  
  bVar2 = false;
  local_70 = 99;
  if (in_RCX == (char *)0x0) {
    local_78 = 0;
  }
  else {
    sVar3 = strlen(in_RCX);
    local_78 = sVar3 + 2;
  }
  if ((in_RDX < 100) && (in_RCX == (char *)0x0)) {
    strncpy(in_RDI,in_RSI,in_RDX);
    in_RDI[in_RDX] = '\0';
  }
  else {
    local_58 = in_RSI + in_RDX;
    while( true ) {
      for (; (in_RSI < local_58 && (local_58[-1] == '/')); local_58 = local_58 + -1) {
        bVar2 = true;
      }
      if (((local_58 <= in_RSI + 1) || (local_58[-1] != '.')) || (local_58[-2] != '/')) break;
      local_58 = local_58 + -2;
      bVar2 = true;
    }
    pcVar4 = local_58;
    if (bVar2) {
      local_70 = 0x62;
    }
    do {
      pcVar1 = pcVar4;
      local_50 = pcVar1 + -1;
      bVar5 = false;
      if (in_RSI < local_50) {
        bVar5 = *local_50 != '/';
      }
      pcVar4 = local_50;
    } while (bVar5);
    if ((*local_50 == '/') && (local_50 < local_58 + -1)) {
      local_50 = pcVar1;
    }
    local_70 = local_70 - local_78;
    if (local_50 + local_70 < local_58) {
      local_58 = local_50 + local_70;
    }
    local_38 = in_RSI + 0x9b;
    if (local_50 < local_38) {
      local_38 = local_50;
    }
    while( true ) {
      bVar5 = false;
      if (in_RSI < local_38) {
        bVar5 = *local_38 != '/';
      }
      if (!bVar5) break;
      local_38 = local_38 + -1;
    }
    if ((local_38 < local_50) && (*local_38 == '/')) {
      local_38 = local_38 + 1;
    }
    local_48 = local_38 + (local_70 - ((long)local_58 - (long)local_50));
    if (local_50 < local_48) {
      local_48 = local_50;
    }
    if (local_48 < local_38) {
      local_48 = local_38;
    }
    while( true ) {
      bVar5 = false;
      if (local_38 < local_48) {
        bVar5 = *local_48 != '/';
      }
      if (!bVar5) break;
      local_48 = local_48 + -1;
    }
    if ((local_48 < local_50) && (*local_48 == '/')) {
      local_48 = local_48 + 1;
    }
    local_60 = in_RDI;
    if (in_RSI < local_38) {
      strncpy(in_RDI,in_RSI,(long)local_38 - (long)in_RSI);
      local_60 = in_RDI + ((long)local_38 - (long)in_RSI);
    }
    if (local_38 < local_48) {
      strncpy(local_60,local_38,(long)local_48 - (long)local_38);
      local_60 = local_60 + ((long)local_48 - (long)local_38);
    }
    if (in_RCX != (char *)0x0) {
      strcpy(local_60,in_RCX);
      sVar3 = strlen(in_RCX);
      pcVar4 = local_60 + sVar3;
      local_60 = pcVar4 + 1;
      *pcVar4 = '/';
    }
    strncpy(local_60,local_50,(long)local_58 - (long)local_50);
    pcVar4 = local_60 + ((long)local_58 - (long)local_50);
    local_60 = pcVar4;
    if (bVar2) {
      local_60 = pcVar4 + 1;
      *pcVar4 = '/';
    }
    *local_60 = '\0';
  }
  return in_RDI;
}

Assistant:

static char *
build_ustar_entry_name(char *dest, const char *src, size_t src_length,
    const char *insert)
{
	const char *prefix, *prefix_end;
	const char *suffix, *suffix_end;
	const char *filename, *filename_end;
	char *p;
	int need_slash = 0; /* Was there a trailing slash? */
	size_t suffix_length = 99;
	size_t insert_length;

	/* Length of additional dir element to be added. */
	if (insert == NULL)
		insert_length = 0;
	else
		/* +2 here allows for '/' before and after the insert. */
		insert_length = strlen(insert) + 2;

	/* Step 0: Quick bailout in a common case. */
	if (src_length < 100 && insert == NULL) {
		strncpy(dest, src, src_length);
		dest[src_length] = '\0';
		return (dest);
	}

	/* Step 1: Locate filename and enforce the length restriction. */
	filename_end = src + src_length;
	/* Remove trailing '/' chars and '/.' pairs. */
	for (;;) {
		if (filename_end > src && filename_end[-1] == '/') {
			filename_end --;
			need_slash = 1; /* Remember to restore trailing '/'. */
			continue;
		}
		if (filename_end > src + 1 && filename_end[-1] == '.'
		    && filename_end[-2] == '/') {
			filename_end -= 2;
			need_slash = 1; /* "foo/." will become "foo/" */
			continue;
		}
		break;
	}
	if (need_slash)
		suffix_length--;
	/* Find start of filename. */
	filename = filename_end - 1;
	while ((filename > src) && (*filename != '/'))
		filename --;
	if ((*filename == '/') && (filename < filename_end - 1))
		filename ++;
	/* Adjust filename_end so that filename + insert fits in 99 chars. */
	suffix_length -= insert_length;
	if (filename_end > filename + suffix_length)
		filename_end = filename + suffix_length;
	/* Calculate max size for "suffix" section (#3 above). */
	suffix_length -= filename_end - filename;

	/* Step 2: Locate the "prefix" section of the dirname, including
	 * trailing '/'. */
	prefix = src;
	prefix_end = prefix + 155;
	if (prefix_end > filename)
		prefix_end = filename;
	while (prefix_end > prefix && *prefix_end != '/')
		prefix_end--;
	if ((prefix_end < filename) && (*prefix_end == '/'))
		prefix_end++;

	/* Step 3: Locate the "suffix" section of the dirname,
	 * including trailing '/'. */
	suffix = prefix_end;
	suffix_end = suffix + suffix_length; /* Enforce limit. */
	if (suffix_end > filename)
		suffix_end = filename;
	if (suffix_end < suffix)
		suffix_end = suffix;
	while (suffix_end > suffix && *suffix_end != '/')
		suffix_end--;
	if ((suffix_end < filename) && (*suffix_end == '/'))
		suffix_end++;

	/* Step 4: Build the new name. */
	/* The OpenBSD strlcpy function is safer, but less portable. */
	/* Rather than maintain two versions, just use the strncpy version. */
	p = dest;
	if (prefix_end > prefix) {
		strncpy(p, prefix, prefix_end - prefix);
		p += prefix_end - prefix;
	}
	if (suffix_end > suffix) {
		strncpy(p, suffix, suffix_end - suffix);
		p += suffix_end - suffix;
	}
	if (insert != NULL) {
		/* Note: assume insert does not have leading or trailing '/' */
		strcpy(p, insert);
		p += strlen(insert);
		*p++ = '/';
	}
	strncpy(p, filename, filename_end - filename);
	p += filename_end - filename;
	if (need_slash)
		*p++ = '/';
	*p = '\0';

	return (dest);
}